

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  ValueType VVar4;
  double dVar5;
  bool local_60;
  bool local_5f;
  bool local_5e;
  bool local_5d;
  bool local_5c;
  bool local_5b;
  bool local_5a;
  bool local_59;
  String local_40;
  ValueType local_1c;
  Value *pVStack_18;
  ValueType other_local;
  Value *this_local;
  
  local_1c = other;
  pVStack_18 = this;
  switch(other) {
  case nullValue:
    bVar1 = isNumeric(this);
    bVar3 = false;
    if (bVar1) {
      dVar5 = asDouble(this);
      local_59 = true;
      if ((dVar5 != 0.0) || (NAN(dVar5))) goto LAB_011f249d;
    }
    else {
LAB_011f249d:
      VVar4 = type(this);
      if ((VVar4 != booleanValue) || (local_59 = true, ((this->value_).bool_ & 1U) != 0)) {
        VVar4 = type(this);
        if (VVar4 == stringValue) {
          asString_abi_cxx11_(&local_40,this);
          bVar3 = true;
          bVar2 = std::__cxx11::string::empty();
          local_59 = true;
          if ((bVar2 & 1) != 0) goto LAB_011f254f;
        }
        VVar4 = type(this);
        if (VVar4 == arrayValue) {
          bVar1 = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::empty((this->value_).map_);
          local_59 = true;
          if (bVar1) goto LAB_011f254f;
        }
        VVar4 = type(this);
        if (VVar4 == objectValue) {
          bVar1 = std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::empty((this->value_).map_);
          local_59 = true;
          if (bVar1) goto LAB_011f254f;
        }
        VVar4 = type(this);
        local_59 = VVar4 == nullValue;
      }
    }
LAB_011f254f:
    this_local._7_1_ = local_59;
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    break;
  case intValue:
    bVar3 = isInt(this);
    local_5a = true;
    if (!bVar3) {
      VVar4 = type(this);
      if (VVar4 == realValue) {
        bVar3 = InRange<int,int>((this->value_).real_,-0x80000000,0x7fffffff);
        local_5a = true;
        if (bVar3) goto LAB_011f25da;
      }
      VVar4 = type(this);
      local_5a = true;
      if (VVar4 != booleanValue) {
        VVar4 = type(this);
        local_5a = VVar4 == nullValue;
      }
    }
LAB_011f25da:
    this_local._7_1_ = local_5a;
    break;
  case uintValue:
    bVar3 = isUInt(this);
    local_5b = true;
    if (!bVar3) {
      VVar4 = type(this);
      if (VVar4 == realValue) {
        bVar3 = InRange<int,unsigned_int>((this->value_).real_,0,0xffffffff);
        local_5b = true;
        if (bVar3) goto LAB_011f2651;
      }
      VVar4 = type(this);
      local_5b = true;
      if (VVar4 != booleanValue) {
        VVar4 = type(this);
        local_5b = VVar4 == nullValue;
      }
    }
LAB_011f2651:
    this_local._7_1_ = local_5b;
    break;
  case realValue:
    bVar3 = isNumeric(this);
    local_5c = true;
    if (!bVar3) {
      VVar4 = type(this);
      local_5c = true;
      if (VVar4 != booleanValue) {
        VVar4 = type(this);
        local_5c = VVar4 == nullValue;
      }
    }
    this_local._7_1_ = local_5c;
    break;
  case stringValue:
    bVar3 = isNumeric(this);
    local_5e = true;
    if (!bVar3) {
      VVar4 = type(this);
      local_5e = true;
      if (VVar4 != booleanValue) {
        VVar4 = type(this);
        local_5e = true;
        if (VVar4 != stringValue) {
          VVar4 = type(this);
          local_5e = VVar4 == nullValue;
        }
      }
    }
    this_local._7_1_ = local_5e;
    break;
  case booleanValue:
    bVar3 = isNumeric(this);
    local_5d = true;
    if (!bVar3) {
      VVar4 = type(this);
      local_5d = true;
      if (VVar4 != booleanValue) {
        VVar4 = type(this);
        local_5d = VVar4 == nullValue;
      }
    }
    this_local._7_1_ = local_5d;
    break;
  case arrayValue:
    VVar4 = type(this);
    local_5f = true;
    if (VVar4 != arrayValue) {
      VVar4 = type(this);
      local_5f = VVar4 == nullValue;
    }
    this_local._7_1_ = local_5f;
    break;
  case objectValue:
    VVar4 = type(this);
    local_60 = true;
    if (VVar4 != objectValue) {
      VVar4 = type(this);
      local_60 = VVar4 == nullValue;
    }
    this_local._7_1_ = local_60;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                  ,0x356,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type() == booleanValue && !value_.bool_) ||
           (type() == stringValue && asString().empty()) ||
           (type() == arrayValue && value_.map_->empty()) ||
           (type() == objectValue && value_.map_->empty()) ||
           type() == nullValue;
  case intValue:
    return isInt() ||
           (type() == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type() == booleanValue || type() == nullValue;
  case uintValue:
    return isUInt() ||
           (type() == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type() == booleanValue || type() == nullValue;
  case realValue:
    return isNumeric() || type() == booleanValue || type() == nullValue;
  case booleanValue:
    return isNumeric() || type() == booleanValue || type() == nullValue;
  case stringValue:
    return isNumeric() || type() == booleanValue || type() == stringValue ||
           type() == nullValue;
  case arrayValue:
    return type() == arrayValue || type() == nullValue;
  case objectValue:
    return type() == objectValue || type() == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}